

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.h
# Opt level: O0

void __thiscall Liby::Channel::Channel(Channel *this,Poller *poller,int fd)

{
  int fd_local;
  Poller *poller_local;
  Channel *this_local;
  
  std::function<void_()>::function(&this->readEventCallback_);
  std::function<void_()>::function(&this->writEventCallback_);
  std::function<void_()>::function(&this->erroEventCallback_);
  this->readable_ = false;
  this->writable_ = false;
  this->old_readable_ = false;
  this->old_writable_ = false;
  this->fd_ = fd;
  this->poller_ = poller;
  if (fd < 0 || poller == (Poller *)0x0) {
    __assert_fail("fd >= 0 && poller",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Channel.h"
                  ,0xe,"Liby::Channel::Channel(Poller *, int)");
  }
  return;
}

Assistant:

Channel(Poller *poller, int fd) : fd_(fd), poller_(poller) {
        assert(fd >= 0 && poller);
    }